

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

AssertionResult
testing::internal::CmpHelperEQ
          (char *expected_expression,char *actual_expression,BiggestInt expected,BiggestInt actual)

{
  string *in_RCX;
  longlong *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  undefined8 in_RDI;
  string *in_R8;
  AssertionResult AVar2;
  longlong *value;
  string local_68 [32];
  string local_48 [23];
  undefined1 in_stack_ffffffffffffffcf;
  string *in_stack_ffffffffffffffd0;
  longlong *expected_expression_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  
  if (in_RCX == in_R8) {
    AVar2 = AssertionSuccess();
    sVar1 = AVar2.message_.ptr_;
  }
  else {
    value = (longlong *)&stack0xffffffffffffffd8;
    expected_expression_00 = in_RDX;
    FormatForComparisonFailureMessage<long_long,long_long>(value,in_RDX);
    FormatForComparisonFailureMessage<long_long,long_long>(value,in_RDX);
    EqFailure((char *)expected_expression_00,(char *)in_RCX,in_R8,in_stack_ffffffffffffffd0,
              (bool)in_stack_ffffffffffffffcf);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_48);
    sVar1.ptr_ = extraout_RDX;
  }
  AVar2.message_.ptr_ = sVar1.ptr_;
  AVar2._0_8_ = in_RDI;
  return AVar2;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            BiggestInt expected,
                            BiggestInt actual) {
  if (expected == actual) {
    return AssertionSuccess();
  }

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}